

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  ushort uVar1;
  u8 uVar2;
  byte bVar3;
  byte bVar4;
  undefined8 in_RAX;
  uint uVar5;
  u16 uVar6;
  uchar *puVar7;
  ulong uVar8;
  uint local_34;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  if (pPage->intKeyLeaf == '\0') {
    if (pPage->noPayload != '\0') {
      uVar2 = sqlite3GetVarint(pCell + 4,(u64 *)pInfo);
      pInfo->nSize = (ushort)(byte)(uVar2 + 4);
      pInfo->pPayload = (u8 *)0x0;
      pInfo->nPayload = 0;
      pInfo->nLocal = 0;
      pInfo->iOverflow = 0;
      return;
    }
    bVar3 = pPage->childPtrSize;
    local_34 = (uint)(char)pCell[bVar3];
    if ((char)pCell[bVar3] < '\0') {
      local_34 = uVar5;
      bVar4 = sqlite3GetVarint32(pCell + bVar3,&local_34);
      uVar8 = (ulong)bVar4;
    }
    else {
      uVar8 = 1;
    }
    puVar7 = pCell + bVar3 + uVar8;
    pInfo->nKey = (ulong)local_34;
  }
  else {
    if ((char)*pCell < '\0') {
      local_34 = uVar5;
      bVar3 = sqlite3GetVarint32(pCell,&local_34);
      uVar8 = (ulong)bVar3;
    }
    else {
      uVar8 = 1;
      local_34 = (int)(char)*pCell;
    }
    bVar3 = sqlite3GetVarint(pCell + uVar8,(u64 *)pInfo);
    puVar7 = pCell + uVar8 + bVar3;
  }
  pInfo->nPayload = local_34;
  pInfo->pPayload = puVar7;
  if (pPage->maxLocal < local_34) {
    uVar1 = pPage->minLocal;
    uVar5 = (local_34 - uVar1) % (pPage->pBt->usableSize - 4) + (uint)uVar1;
    if ((int)(uint)pPage->maxLocal < (int)uVar5) {
      uVar5 = (uint)uVar1;
    }
    pInfo->nLocal = (u16)uVar5;
    uVar6 = ((short)puVar7 + (u16)uVar5) - (short)pCell;
    pInfo->iOverflow = uVar6;
    pInfo->nSize = uVar6 + 4;
  }
  else {
    uVar5 = ((int)puVar7 - (int)pCell) + local_34;
    uVar6 = 4;
    if ((uVar5 & 0xfffc) != 0) {
      uVar6 = (u16)uVar5;
    }
    pInfo->nSize = uVar6;
    pInfo->nLocal = (u16)local_34;
    pInfo->iOverflow = 0;
  }
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  if( pPage->intKeyLeaf ){
    assert( pPage->childPtrSize==0 );
    pIter = pCell + getVarint32(pCell, nPayload);
    pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  }else if( pPage->noPayload ){
    assert( pPage->childPtrSize==4 );
    pInfo->nSize = 4 + getVarint(&pCell[4], (u64*)&pInfo->nKey);
    pInfo->nPayload = 0;
    pInfo->nLocal = 0;
    pInfo->iOverflow = 0;
    pInfo->pPayload = 0;
    return;
  }else{
    pIter = pCell + pPage->childPtrSize;
    pIter += getVarint32(pIter, nPayload);
    pInfo->nKey = nPayload;
  }
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
    pInfo->iOverflow = 0;
  }else{
    /* If the payload will not fit completely on the local page, we have
    ** to decide how much to store locally and how much to spill onto
    ** overflow pages.  The strategy is to minimize the amount of unused
    ** space on overflow pages while keeping the amount of local storage
    ** in between minLocal and maxLocal.
    **
    ** Warning:  changing the way overflow payload is distributed in any
    ** way will result in an incompatible file format.
    */
    int minLocal;  /* Minimum amount of payload held locally */
    int maxLocal;  /* Maximum amount of payload held locally */
    int surplus;   /* Overflow payload available for local storage */

    minLocal = pPage->minLocal;
    maxLocal = pPage->maxLocal;
    surplus = minLocal + (nPayload - minLocal)%(pPage->pBt->usableSize - 4);
    testcase( surplus==maxLocal );
    testcase( surplus==maxLocal+1 );
    if( surplus <= maxLocal ){
      pInfo->nLocal = (u16)surplus;
    }else{
      pInfo->nLocal = (u16)minLocal;
    }
    pInfo->iOverflow = (u16)(&pInfo->pPayload[pInfo->nLocal] - pCell);
    pInfo->nSize = pInfo->iOverflow + 4;
  }
}